

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool nakagami_check(double param_1,double b,double c)

{
  char *pcVar1;
  
  if (b <= 0.0) {
    pcVar1 = "  B <= 0.\n";
  }
  else {
    if (0.0 < c) {
      return true;
    }
    pcVar1 = "  C <= 0.\n";
  }
  std::operator<<((ostream *)&std::cout," \n");
  std::operator<<((ostream *)&std::cout,"NAKAGAMI_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cout,pcVar1);
  return false;
}

Assistant:

bool nakagami_check ( double /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    NAKAGAMI_CHECK checks the parameters of the Nakagami PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, bool NAKAGAMI_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "NAKAGAMI_CHECK - Warning!\n";
    cout << "  B <= 0.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cout << " \n";
    cout << "NAKAGAMI_CHECK - Warning!\n";
    cout << "  C <= 0.\n";
    return false;
  }

  return true;
}